

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

void __thiscall
absl::debugging_internal::ElfMemImage::SymbolIterator::Update(SymbolIterator *this,int increment)

{
  uint uVar1;
  uint uVar2;
  ElfMemImage *this_00;
  char *pcVar3;
  Elf64_Word EVar4;
  Elf64_Ehdr *pEVar5;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar6;
  Elf64_Verdef *pEVar7;
  void *pvVar8;
  int index;
  char *pcVar9;
  
  this_00 = (ElfMemImage *)this->image_;
  pEVar5 = this_00->ehdr_;
  if (increment != 0 && pEVar5 == (Elf64_Ehdr *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x155,"Check %s failed: %s",
               "image->IsPresent() || increment == 0","");
    pEVar5 = this_00->ehdr_;
  }
  if (pEVar5 == (Elf64_Ehdr *)0x0) {
    return;
  }
  index = increment + this->index_;
  this->index_ = index;
  if (this_00->hash_ == (Elf64_Word *)0x0) {
    EVar4 = 0;
    if (-1 < index) goto LAB_00149aaf;
  }
  else {
    EVar4 = this_00->hash_[1];
    if ((int)EVar4 <= index) {
LAB_00149aaf:
      this->index_ = EVar4;
      return;
    }
  }
  sym = GetDynsym(this_00,index);
  pEVar6 = GetVersym(this_00,this->index_);
  if ((sym == (Elf64_Sym *)0x0) || (pEVar6 == (Elf64_Versym *)0x0)) {
    Update();
  }
  uVar1 = sym->st_name;
  if (this_00->strsize_ <= (ulong)uVar1) {
    Update();
  }
  pcVar9 = "";
  pcVar3 = this_00->dynstr_;
  if ((sym->st_shndx != 0) &&
     (pEVar7 = GetVerdef(this_00,*pEVar6 & 0x7fff), pEVar7 != (Elf64_Verdef *)0x0)) {
    if ((ushort)(pEVar7->vd_cnt - 3) < 0xfffe) {
      Update();
    }
    uVar2._0_2_ = pEVar7[1].vd_version;
    uVar2._2_2_ = pEVar7[1].vd_flags;
    if (this_00->strsize_ <= (ulong)uVar2) {
      Update();
    }
    pcVar9 = this_00->dynstr_ + uVar2;
  }
  (this->info_).name = pcVar3 + uVar1;
  (this->info_).version = pcVar9;
  pvVar8 = GetSymAddr(this_00,sym);
  (this->info_).address = pvVar8;
  (this->info_).symbol = sym;
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(int increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}